

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void duckdb::ListCombineFunction
               (Vector *states_vector,Vector *combined,AggregateInputData *aggr_input_data,
               idx_t count)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  Vector *pVVar5;
  RecursiveUnifiedVectorFormat *pRVar6;
  FunctionData *pFVar7;
  LogicalType *pLVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t iVar13;
  UnifiedVectorFormat *this;
  LogicalType result_type;
  UnifiedVectorFormat states_data;
  RecursiveUnifiedVectorFormat input_data;
  Vector input;
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  long *local_158;
  long local_150;
  long *local_110;
  long local_108;
  Vector local_98 [104];
  
  if (aggr_input_data->combine_type == ALLOW_DESTRUCTIVE) {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_110);
    duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
    lVar1 = *(long *)(combined + 0x20);
    for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
      iVar13 = iVar11;
      if (*local_110 != 0) {
        iVar13 = (idx_t)*(uint *)(*local_110 + iVar11 * 4);
      }
      plVar2 = *(long **)(local_108 + iVar13 * 8);
      lVar3 = *plVar2;
      if (lVar3 != 0) {
        plVar4 = *(long **)(lVar1 + iVar11 * 8);
        if (*plVar4 == 0) {
          plVar4[2] = plVar2[2];
          lVar3 = plVar2[1];
          *plVar4 = *plVar2;
          plVar4[1] = lVar3;
        }
        else {
          *(long *)(plVar4[2] + 8) = plVar2[1];
          *(long *)(*(long *)(lVar1 + iVar11 * 8) + 0x10) = plVar2[2];
          plVar2 = *(long **)(lVar1 + iVar11 * 8);
          *plVar2 = *plVar2 + lVar3;
        }
      }
    }
    this = (UnifiedVectorFormat *)&local_110;
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_158);
    duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
    lVar1 = *(long *)(combined + 0x20);
    pFVar7 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
    pLVar8 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pFVar7 + 8));
    duckdb::LogicalType::LogicalType(local_188,pLVar8);
    for (uVar12 = 0; uVar12 != count; uVar12 = uVar12 + 1) {
      uVar9 = uVar12;
      if (*local_158 != 0) {
        uVar9 = (ulong)*(uint *)(*local_158 + uVar12 * 4);
      }
      pVVar5 = *(Vector **)(local_150 + uVar9 * 8);
      pRVar6 = *(RecursiveUnifiedVectorFormat **)(lVar1 + uVar12 * 8);
      uVar9 = *(ulong *)pVVar5;
      duckdb::LogicalType::LogicalType(local_170,local_188);
      duckdb::Vector::Vector(local_98,local_170,*(undefined8 *)pVVar5);
      duckdb::LogicalType::~LogicalType(local_170);
      duckdb::ListSegmentFunctions::BuildListVector
                ((LinkedList *)(pFVar7 + 0x20),pVVar5,(ulong)local_98);
      RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat
                ((RecursiveUnifiedVectorFormat *)&local_110);
      duckdb::Vector::RecursiveToUnifiedFormat
                (local_98,uVar9,(RecursiveUnifiedVectorFormat *)&local_110);
      for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
        duckdb::ArenaAllocator::AlignNext();
        duckdb::ListSegmentFunctions::AppendRow
                  ((ArenaAllocator *)(pFVar7 + 0x20),(LinkedList *)aggr_input_data->allocator,pRVar6
                   ,(ulong *)&local_110);
      }
      RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat
                ((RecursiveUnifiedVectorFormat *)&local_110);
      Vector::~Vector(local_98);
    }
    duckdb::LogicalType::~LogicalType(local_188);
    this = (UnifiedVectorFormat *)&local_158;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ListCombineFunction(Vector &states_vector, Vector &combined, AggregateInputData &aggr_input_data,
                                idx_t count) {

	//	Can we use destructive combining?
	if (aggr_input_data.combine_type == AggregateCombineType::ALLOW_DESTRUCTIVE) {
		ListAbsorbFunction(states_vector, combined, aggr_input_data, count);
		return;
	}

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states_ptr = UnifiedVectorFormat::GetData<const ListAggState *>(states_data);
	auto combined_ptr = FlatVector::GetData<ListAggState *>(combined);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();
	auto result_type = ListType::GetChildType(list_bind_data.stype);

	for (idx_t i = 0; i < count; i++) {
		auto &source = *states_ptr[states_data.sel->get_index(i)];
		auto &target = *combined_ptr[i];

		const auto entry_count = source.linked_list.total_capacity;
		Vector input(result_type, source.linked_list.total_capacity);
		list_bind_data.functions.BuildListVector(source.linked_list, input, 0);

		RecursiveUnifiedVectorFormat input_data;
		Vector::RecursiveToUnifiedFormat(input, entry_count, input_data);

		for (idx_t entry_idx = 0; entry_idx < entry_count; ++entry_idx) {
			aggr_input_data.allocator.AlignNext();
			list_bind_data.functions.AppendRow(aggr_input_data.allocator, target.linked_list, input_data, entry_idx);
		}
	}
}